

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtc.c
# Opt level: O0

void run_command(uint8_t command)

{
  char *pcVar1;
  byte in_DIL;
  bool bVar2;
  uint8_t reg;
  _Bool read;
  rtc_t *rtc;
  undefined7 in_stack_00000010;
  rtc_t *rtc_00;
  
  rtc_00 = &bus->rtc;
  bVar2 = (int)(uint)in_DIL >> 3 != 0;
  if (2 < gba_log_verbosity) {
    pcVar1 = "Writ";
    if (bVar2) {
      pcVar1 = "Read";
    }
    printf("[DEBUG] [GPIO] [RTC] %sing register: 0x%X\n",pcVar1,(ulong)(in_DIL & 7));
  }
  rtc_00->reg = in_DIL & 7;
  if (bVar2) {
    read_register((rtc_t *)CONCAT17(command,in_stack_00000010));
    rtc_00->state = RTC_DATA_READ;
  }
  else {
    write_register(rtc_00);
    rtc_00->state = RTC_DATA_WRITE;
  }
  return;
}

Assistant:

void run_command(byte command) {
    rtc_t* rtc = &bus->rtc;
    bool read = command >> 3;
    byte reg = command & 0x7;

    logdebug("[GPIO] [RTC] %sing register: 0x%X", read ? "Read" : "Writ", reg);

    rtc->reg = reg;

    if (read) {
        read_register(rtc);
        rtc->state = RTC_DATA_READ;
    } else {
        write_register(rtc);
        rtc->state = RTC_DATA_WRITE;
    }
}